

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbox.cpp
# Opt level: O0

void __thiscall ftxui::HBox::HBox(HBox *this,Elements *children)

{
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_30;
  Elements *local_18;
  Elements *children_local;
  HBox *this_local;
  
  local_18 = children;
  children_local = (Elements *)this;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_30,children);
  Node::Node(&this->super_Node,&local_30);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_30);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__HBox_0021a640;
  return;
}

Assistant:

HBox(Elements children) : Node(std::move(children)) {}